

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

void stbtt__csctx_v(stbtt__csctx *c,stbtt_uint8 type,stbtt_int32 x,stbtt_int32 y,stbtt_int32 cx,
                   stbtt_int32 cy,stbtt_int32 cx1,stbtt_int32 cy1)

{
  int iVar1;
  stbtt_vertex *psVar2;
  
  if (c->bounds == 0) {
    iVar1 = c->num_vertices;
    psVar2 = c->pvertices;
    psVar2[iVar1].type = type;
    psVar2[iVar1].x = (short)x;
    psVar2[iVar1].y = (short)y;
    psVar2[iVar1].cx = (short)cx;
    psVar2[iVar1].cy = (short)cy;
    psVar2[iVar1].cx1 = (short)cx1;
    psVar2[iVar1].cy1 = (short)cy1;
  }
  else {
    stbtt__track_vertex(c,x,y);
    if (type == '\x04') {
      stbtt__track_vertex(c,cx,cy);
      stbtt__track_vertex(c,cx1,cy1);
    }
  }
  c->num_vertices = c->num_vertices + 1;
  return;
}

Assistant:

static void stbtt__csctx_v(stbtt__csctx *c, stbtt_uint8 type, stbtt_int32 x, stbtt_int32 y, stbtt_int32 cx, stbtt_int32 cy, stbtt_int32 cx1, stbtt_int32 cy1)
{
   if (c->bounds) {
      stbtt__track_vertex(c, x, y);
      if (type == STBTT_vcubic) {
         stbtt__track_vertex(c, cx, cy);
         stbtt__track_vertex(c, cx1, cy1);
      }
   } else {
      stbtt_setvertex(&c->pvertices[c->num_vertices], type, x, y, cx, cy);
      c->pvertices[c->num_vertices].cx1 = (stbtt_int16) cx1;
      c->pvertices[c->num_vertices].cy1 = (stbtt_int16) cy1;
   }
   c->num_vertices++;
}